

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  RepeatedField<int> *values;
  char *data;
  bool bVar1;
  uint uVar2;
  string *psVar3;
  Type *pTVar4;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  FileOptions *value_03;
  SourceCodeInfo *value_04;
  uint8 *puVar5;
  uint32 tag;
  int iVar6;
  RepeatedPtrFieldBase *this_00;
  uint32 temp;
  uint32 local_70;
  uint32 local_6c;
  RepeatedPtrFieldBase *local_68;
  RepeatedField<int> *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_60 = &this->weak_dependency_;
  values = &this->public_dependency_;
  this_00 = &(this->dependency_).super_RepeatedPtrFieldBase;
  local_58 = &(this->message_type_).super_RepeatedPtrFieldBase;
  local_50 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_48 = &(this->service_).super_RepeatedPtrFieldBase;
  local_40 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_38 = &this->_unknown_fields_;
  local_68 = this_00;
LAB_001f04d8:
  puVar5 = input->buffer_;
  if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar5 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar2 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar2 != 2) break;
    psVar3 = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,psVar3);
    if (!bVar1) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x12')) {
      input->buffer_ = puVar5 + 1;
LAB_001f05f2:
      psVar3 = mutable_package_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar3);
      if (!bVar1) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,PARSE);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x1a')) {
        do {
          input->buffer_ = puVar5 + 1;
LAB_001f06a5:
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_00);
          bVar1 = internal::WireFormatLite::ReadString(input,pTVar4);
          if (!bVar1) {
            return false;
          }
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_00,(this->dependency_).super_RepeatedPtrFieldBase.current_size_ +
                                      -1);
          data = (pTVar4->_M_dataplus)._M_p;
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (local_68,(this->dependency_).super_RepeatedPtrFieldBase.current_size_
                                       + -1);
          this_00 = local_68;
          internal::WireFormat::VerifyUTF8StringFallback(data,(int)pTVar4->_M_string_length,PARSE);
          puVar5 = input->buffer_;
          if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
        } while (*puVar5 == '\x1a');
        if (*puVar5 == '\"') {
          do {
            input->buffer_ = puVar5 + 1;
LAB_001f0716:
            value = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                              (local_58);
            bVar1 = internal::WireFormatLite::
                    ReadMessageNoVirtual<google::protobuf::DescriptorProto>(input,value);
            if (!bVar1) {
              return false;
            }
            puVar5 = input->buffer_;
            if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
          } while (*puVar5 == '\"');
          if (*puVar5 == '*') {
            do {
              input->buffer_ = puVar5 + 1;
LAB_001f0756:
              value_00 = internal::RepeatedPtrFieldBase::
                         Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                                   (local_50);
              bVar1 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_00);
              if (!bVar1) {
                return false;
              }
              puVar5 = input->buffer_;
              if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
            } while (*puVar5 == '*');
            if (*puVar5 == '2') {
              do {
                input->buffer_ = puVar5 + 1;
LAB_001f0796:
                value_01 = internal::RepeatedPtrFieldBase::
                           Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                                     (local_48);
                bVar1 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::ServiceDescriptorProto>
                                  (input,value_01);
                if (!bVar1) {
                  return false;
                }
                puVar5 = input->buffer_;
                if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
              } while (*puVar5 == '2');
              if (*puVar5 == ':') {
                do {
                  input->buffer_ = puVar5 + 1;
LAB_001f07d6:
                  value_02 = internal::RepeatedPtrFieldBase::
                             Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                                       (local_40);
                  bVar1 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>
                                    (input,value_02);
                  if (!bVar1) {
                    return false;
                  }
                  puVar5 = input->buffer_;
                  if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
                } while (*puVar5 == ':');
                if (*puVar5 == 'B') {
                  input->buffer_ = puVar5 + 1;
LAB_001f0816:
                  value_03 = mutable_options(this);
                  bVar1 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::FileOptions>(input,value_03);
                  if (!bVar1) {
                    return false;
                  }
                  puVar5 = input->buffer_;
                  if ((puVar5 < input->buffer_end_) && (*puVar5 == 'J')) {
                    input->buffer_ = puVar5 + 1;
LAB_001f084f:
                    value_04 = mutable_source_code_info(this);
                    bVar1 = internal::WireFormatLite::
                            ReadMessageNoVirtual<google::protobuf::SourceCodeInfo>(input,value_04);
                    if (!bVar1) {
                      return false;
                    }
                    puVar5 = input->buffer_;
                    if ((puVar5 < input->buffer_end_) && (*puVar5 == 'P')) {
                      do {
                        input->buffer_ = puVar5 + 1;
LAB_001f0888:
                        bVar1 = io::CodedInputStream::ReadVarint32(input,&local_6c);
                        if (!bVar1) {
                          return false;
                        }
                        local_70 = local_6c;
                        RepeatedField<int>::Add(values,(int *)&local_70);
                        iVar6 = (this->public_dependency_).total_size_ -
                                (this->public_dependency_).current_size_;
                        while (((this_00 = local_68, 0 < iVar6 &&
                                (puVar5 = input->buffer_, puVar5 < input->buffer_end_)) &&
                               (*puVar5 == 'P'))) {
                          input->buffer_ = puVar5 + 1;
                          bVar1 = io::CodedInputStream::ReadVarint32(input,&local_6c);
                          if (!bVar1) {
                            return false;
                          }
                          local_70 = local_6c;
                          RepeatedField<int>::AddAlreadyReserved(values,(int *)&local_70);
                          iVar6 = iVar6 + -1;
                        }
LAB_001f0905:
                        puVar5 = input->buffer_;
                        if (input->buffer_end_ <= puVar5) goto LAB_001f04d8;
                      } while (*puVar5 == 'P');
                      if (*puVar5 == 'X') {
                        do {
                          input->buffer_ = puVar5 + 1;
LAB_001f092c:
                          bVar1 = io::CodedInputStream::ReadVarint32(input,&local_6c);
                          if (!bVar1) {
                            return false;
                          }
                          local_70 = local_6c;
                          RepeatedField<int>::Add(local_60,(int *)&local_70);
                          iVar6 = (this->weak_dependency_).total_size_ -
                                  (this->weak_dependency_).current_size_;
                          while (((this_00 = local_68, 0 < iVar6 &&
                                  (puVar5 = input->buffer_, puVar5 < input->buffer_end_)) &&
                                 (*puVar5 == 'X'))) {
                            input->buffer_ = puVar5 + 1;
                            bVar1 = io::CodedInputStream::ReadVarint32(input,&local_6c);
                            if (!bVar1) {
                              return false;
                            }
                            local_70 = local_6c;
                            RepeatedField<int>::AddAlreadyReserved(local_60,(int *)&local_70);
                            iVar6 = iVar6 + -1;
                          }
LAB_001f09a9:
                          puVar5 = input->buffer_;
                        } while ((puVar5 < input->buffer_end_) && (*puVar5 == 'X'));
                        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
                        if (bVar1) {
                          return true;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_001f04d8;
  case 2:
    if (uVar2 == 2) goto LAB_001f05f2;
    break;
  case 3:
    if (uVar2 == 2) goto LAB_001f06a5;
    break;
  case 4:
    if (uVar2 == 2) goto LAB_001f0716;
    break;
  case 5:
    if (uVar2 == 2) goto LAB_001f0756;
    break;
  case 6:
    if (uVar2 == 2) goto LAB_001f0796;
    break;
  case 7:
    if (uVar2 == 2) goto LAB_001f07d6;
    break;
  case 8:
    if (uVar2 == 2) goto LAB_001f0816;
    break;
  case 9:
    if (uVar2 == 2) goto LAB_001f084f;
    break;
  case 10:
    if (uVar2 == 0) goto LAB_001f0888;
    if (uVar2 == 2) {
      bVar1 = internal::WireFormatLite::
              ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,values);
      if (bVar1) goto LAB_001f0905;
      return false;
    }
    break;
  case 0xb:
    if (uVar2 == 0) goto LAB_001f092c;
    if (uVar2 == 2) {
      bVar1 = internal::WireFormatLite::
              ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,local_60);
      if (bVar1) goto LAB_001f09a9;
      return false;
    }
  }
  if (uVar2 == 4) {
    return true;
  }
  bVar1 = internal::WireFormat::SkipField(input,tag,local_38);
  if (!bVar1) {
    return false;
  }
  goto LAB_001f04d8;
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_package;
        break;
      }

      // optional string package = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_dependency:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        if (input->ExpectTag(34)) goto parse_message_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_message_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_message_type;
        if (input->ExpectTag(42)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_enum_type;
        if (input->ExpectTag(50)) goto parse_service;
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_service:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_service;
        if (input->ExpectTag(58)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_extension;
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_source_code_info;
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_source_code_info:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_public_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80, input, this->mutable_public_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88, input, this->mutable_weak_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}